

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanIpIfAddrs.hpp
# Opt level: O1

vector<asio::ip::address,_std::allocator<asio::ip::address>_> * __thiscall
ableton::platforms::posix::ScanIpIfAddrs::operator()
          (vector<asio::ip::address,_std::allocator<asio::ip::address>_> *__return_storage_ptr__,
          ScanIpIfAddrs *this)

{
  int iVar1;
  GetIfAddrs getIfAddrs;
  GetIfAddrs local_18;
  
  (__return_storage_ptr__->super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18.interfaces = (ifaddrs *)0x0;
  iVar1 = getifaddrs();
  if (iVar1 != 0) {
    local_18.interfaces = (ifaddrs *)0x0;
  }
  detail::GetIfAddrs::operator()(&local_18,(anon_class_8_1_a79fd1c2)__return_storage_ptr__);
  if (local_18.interfaces != (ifaddrs *)0x0) {
    freeifaddrs();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<::asio::ip::address> operator()()
  {
    std::vector<::asio::ip::address> addrs;

    detail::GetIfAddrs getIfAddrs;
    getIfAddrs.withIfAddrs([&addrs](const struct ifaddrs& interfaces) {
      const struct ifaddrs* interface;
      for (interface = &interfaces; interface; interface = interface->ifa_next)
      {
        auto addr = reinterpret_cast<const struct sockaddr_in*>(interface->ifa_addr);
        if (addr && interface->ifa_flags & IFF_UP)
        {
          if (addr->sin_family == AF_INET)
          {
            auto bytes = reinterpret_cast<const char*>(&addr->sin_addr);
            addrs.emplace_back(asio::makeAddress<::asio::ip::address_v4>(bytes));
          }
          else if (addr->sin_family == AF_INET6)
          {
            auto addr6 = reinterpret_cast<const struct sockaddr_in6*>(addr);
            auto bytes = reinterpret_cast<const char*>(&addr6->sin6_addr);
            addrs.emplace_back(asio::makeAddress<::asio::ip::address_v6>(bytes));
          }
        }
      }
    });
    return addrs;
  }